

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void ncnn::resize_bilinear(Mat *src,Mat *dst,int w,int h)

{
  int iVar1;
  bool bVar2;
  int in_ECX;
  int in_EDX;
  long in_RDI;
  Mat resizem;
  Mat m;
  int q;
  int channels;
  int in_stack_00000110;
  int in_stack_00000114;
  Mat *in_stack_00000118;
  Mat *in_stack_00000120;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  Mat *in_stack_ffffffffffffff90;
  int local_20;
  
  if ((in_EDX == *(int *)(in_RDI + 0x1c)) && (in_ECX == *(int *)(in_RDI + 0x20))) {
    Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (Mat *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  }
  else if (*(int *)(in_RDI + 0x18) == 2) {
    Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    if (!bVar2) {
      resize_bilinear_image(in_stack_00000120,in_stack_00000118,in_stack_00000114,in_stack_00000110)
      ;
    }
  }
  else if (*(int *)(in_RDI + 0x18) == 3) {
    iVar1 = *(int *)(in_RDI + 0x24);
    Mat::create(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
                in_stack_ffffffffffffff84,
                CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    if (!bVar2) {
      for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                     in_stack_ffffffffffffff74);
        Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                     in_stack_ffffffffffffff74);
        resize_bilinear_image
                  (in_stack_00000120,in_stack_00000118,in_stack_00000114,in_stack_00000110);
        Mat::~Mat((Mat *)0x14fcc0);
        Mat::~Mat((Mat *)0x14fcca);
      }
    }
  }
  return;
}

Assistant:

void resize_bilinear(const Mat& src, Mat& dst, int w, int h)
{
    if (w == src.w && h == src.h)
    {
        dst = src;
        return;
    }

    if (src.dims == 2)
    {
        dst.create(w, h);
        if (dst.empty())
            return;

        resize_bilinear_image(src, dst, w, h);
    }
    else if (src.dims == 3)
    {
        int channels = src.c;

        dst.create(w, h, channels);
        if (dst.empty())
            return;

        // unroll image channel
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const Mat m = src.channel(q);
            Mat resizem = dst.channel(q);

            resize_bilinear_image(m, resizem, w, h);
        }
    }
}